

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfdec.c
# Opt level: O3

int file_is_ivf(AvxInputContext *input_ctx)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  uchar raw_hdr [32];
  int local_28;
  short local_24;
  uint32_t local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  
  sVar2 = buffer_input(input_ctx,0x20,(uchar *)&local_28,true);
  if ((sVar2 == 0x20) && (local_28 == 0x46494b44)) {
    if (local_24 != 0) {
      file_is_ivf_cold_1();
    }
    input_ctx->fourcc = local_20;
    uVar3 = (ulong)(CONCAT24((short)((uint)local_1c >> 0x10),local_1c) & 0xffff0000ffff);
    input_ctx->width = (int)uVar3;
    input_ctx->height = (int)(uVar3 >> 0x20);
    (input_ctx->framerate).numerator = local_18;
    (input_ctx->framerate).denominator = local_14;
    iVar1 = 1;
    if (local_18 - 1000U < 0xfffffc19 || local_14 + 0xc4653600U < 0xc4653601) {
      (input_ctx->framerate).numerator = 0x1e;
      (input_ctx->framerate).denominator = 1;
    }
  }
  else {
    rewind_detect(input_ctx);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int file_is_ivf(struct AvxInputContext *input_ctx) {
  unsigned char raw_hdr[32];
  int is_ivf = 0;

  if (buffer_input(input_ctx, 32, raw_hdr, /*buffered=*/true) == 32) {
    if (memcmp(IVF_SIGNATURE, raw_hdr, 4) == 0) {
      is_ivf = 1;

      if (mem_get_le16(raw_hdr + 4) != 0) {
        fprintf(stderr,
                "Error: Unrecognized IVF version! This file may not"
                " decode properly.\n");
      }

      input_ctx->fourcc = mem_get_le32(raw_hdr + 8);
      input_ctx->width = mem_get_le16(raw_hdr + 12);
      input_ctx->height = mem_get_le16(raw_hdr + 14);
      input_ctx->framerate.numerator = mem_get_le32(raw_hdr + 16);
      input_ctx->framerate.denominator = mem_get_le32(raw_hdr + 20);
      fix_framerate(&input_ctx->framerate.numerator,
                    &input_ctx->framerate.denominator);
    }
  }

  if (!is_ivf) {
    rewind_detect(input_ctx);
  }
  return is_ivf;
}